

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

int cs_op_index(csh ud,cs_insn *insn,uint op_type,uint post)

{
  cs_detail *pcVar1;
  int iVar2;
  uint *puVar3;
  x86_sse_cc *pxVar4;
  arm_vectordata_type *paVar5;
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar6;
  arm_cc *paVar7;
  x86_avx_cc *pxVar8;
  cs_arm_op *pcVar9;
  ulong uVar10;
  uint uVar11;
  
  iVar2 = -1;
  if (ud == 0) {
    return iVar2;
  }
  if (*(int *)(ud + 0xe0) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x58) = 0xb;
      return iVar2;
    }
    pcVar1 = insn->detail;
    if (pcVar1 != (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x58) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        puVar3 = (uint *)&(pcVar1->field_6).x86.operands[0].field_0x4;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          if ((pcVar1->field_6).arm.op_count == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + (*puVar3 == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
          puVar3 = puVar3 + 10;
        }
        break;
      case 1:
        pxVar8 = &(pcVar1->field_6).x86.avx_cc;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          if ((pcVar1->field_6).x86.opcode[2] == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + (*pxVar8 == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
          pxVar8 = pxVar8 + 0xc;
        }
        break;
      case 2:
        paVar5 = &(pcVar1->field_6).arm.vector_data;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          if ((pcVar1->field_6).x86.prefix[0] == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + (*paVar5 == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
          paVar5 = paVar5 + 6;
        }
        break;
      case 3:
        paVar6 = &pcVar1->field_6;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          paVar6 = (anon_union_1480_8_3a70395c_for_cs_detail_6 *)(paVar6->x86).operands;
          if ((pcVar1->field_6).x86.op_count == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + ((paVar6->arm64).cc == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
        }
        break;
      case 4:
        pxVar4 = (x86_sse_cc *)&(pcVar1->field_6).x86.disp;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          if ((pcVar1->field_6).x86.addr_size == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + (*pxVar4 == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
          pxVar4 = pxVar4 + 4;
        }
        break;
      case 5:
        paVar6 = &pcVar1->field_6;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          paVar6 = (anon_union_1480_8_3a70395c_for_cs_detail_6 *)&(paVar6->x86).disp;
          if ((pcVar1->field_6).x86.rex == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + ((paVar6->arm64).cc == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
        }
        break;
      case 6:
        pcVar9 = (cs_arm_op *)&(pcVar1->field_6).arm.vector_data;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          if ((pcVar1->field_6).x86.opcode[0] == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + (pcVar9->vector_index == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
          pcVar9 = (cs_arm_op *)&pcVar9->subtracted;
        }
        break;
      case 7:
        paVar7 = (arm_cc *)&(pcVar1->field_6).arm.vector_size;
        uVar10 = 0;
        uVar11 = 0;
        while( true ) {
          if ((pcVar1->field_6).x86.prefix[0] == uVar10) {
            return iVar2;
          }
          uVar11 = uVar11 + (*paVar7 == op_type);
          if (uVar11 == post) break;
          uVar10 = uVar10 + 1;
          paVar7 = paVar7 + 4;
        }
        break;
      default:
        *(undefined4 *)(ud + 0x58) = 3;
        return iVar2;
      }
      return (int)uVar10;
    }
  }
  *(undefined4 *)(ud + 0x58) = 7;
  return iVar2;
}

Assistant:

CAPSTONE_EXPORT
int cs_op_index(csh ud, const cs_insn *insn, unsigned int op_type,
		unsigned int post)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++) {
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++) {
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++) {
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++) {
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++) {
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++) {
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++) {
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++) {
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
				if (count == post)
					return i;
			}
			break;
	}

	return -1;
}